

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O2

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer ppVar2;
  pointer pIVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint id;
  uint id_00;
  uint id_01;
  AddressingModel AVar8;
  Op OVar9;
  uint32_t id_02;
  StorageClass SVar10;
  Instruction *pIVar11;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var12;
  long lVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  Instruction *this;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar16;
  _Rb_tree_const_iterator<spvtools::val::Decoration> _Var17;
  Instruction *rhs;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  pointer this_00;
  spv_result_t sVar21;
  _Rb_tree_header *p_Var22;
  char *pcVar23;
  ulong uVar24;
  pointer ppVar25;
  size_t sVar26;
  string local_268;
  vector<spv::Op,_std::allocator<spv::Op>_> acceptable;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x39) {
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 0x36)) {
      pIVar14 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
      if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).result_id != (inst->inst_).type_id))
      {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"OpFunctionCall Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_268,_,(inst->inst_).type_id);
        std::operator<<((ostream *)&local_208,(string *)&local_268);
        std::operator<<((ostream *)&local_208,"s type does not match Function <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,(pIVar14->inst_).result_id);
        std::operator<<((ostream *)&local_208,(string *)&acceptable);
        pcVar23 = "s return type.";
        goto LAB_0028b0f2;
      }
      uVar24 = 3;
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,3);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x21)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar23 = "Missing function type definition.";
      }
      else {
        if ((long)(pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2 ==
            ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
          sVar26 = 2;
          do {
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar24) {
              return SPV_SUCCESS;
            }
            uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,uVar24);
            pIVar14 = ValidationState_t::FindDef(_,uVar7);
            if (pIVar14 == (Instruction *)0x0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,"Missing argument ");
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar23 = " definition.";
              goto LAB_0028b214;
            }
            pIVar15 = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
            if (pIVar15 == (Instruction *)0x0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,"Missing argument ");
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar23 = " type definition.";
              goto LAB_0028b214;
            }
            id = Instruction::GetOperandAs<unsigned_int>(pIVar11,sVar26);
            this = ValidationState_t::FindDef(_,id);
            if ((this == (Instruction *)0x0) ||
               ((pIVar15->inst_).result_id != (this->inst_).result_id)) {
              if ((_->options_->before_hlsl_legalization != true) ||
                 (((pIVar15->inst_).opcode != 0x20 || ((this->inst_).opcode != 0x20)))) {
LAB_0028b494:
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"OpFunctionCall Argument <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
                std::operator<<((ostream *)&local_208,(string *)&local_268);
                std::operator<<((ostream *)&local_208,"s type does not match Function <id> ");
                ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,id);
                std::operator<<((ostream *)&local_208,(string *)&acceptable);
                pcVar23 = "s parameter type.";
                goto LAB_0028b0f2;
              }
              psVar18 = ValidationState_t::id_decorations(_,(pIVar15->inst_).result_id);
              psVar16 = ValidationState_t::id_decorations(_,(this->inst_).result_id);
              p_Var22 = &(psVar18->_M_t)._M_impl.super__Rb_tree_header;
              for (p_Var20 = (psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var20 != &(psVar16->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
                _Var17 = std::
                         __find_if<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::Decoration_const>>
                                   ((psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                                    p_Var22,p_Var20 + 1);
                if ((_Rb_tree_header *)_Var17._M_node == p_Var22) goto LAB_0028b494;
              }
              id_00 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
              id_01 = Instruction::GetOperandAs<unsigned_int>(this,2);
              if (id_00 != id_01) {
                pIVar15 = ValidationState_t::FindDef(_,id_00);
                rhs = ValidationState_t::FindDef(_,id_01);
                bVar5 = ValidationState_t::LogicallyMatch(_,pIVar15,rhs,true);
                if (!bVar5) goto LAB_0028b494;
              }
            }
            AVar8 = ValidationState_t::addressing_model(_);
            if ((AVar8 == Logical) &&
               (((uVar1 = (this->inst_).opcode, uVar1 == 0x1141 || (uVar1 == 0x20)) &&
                (_->options_->relax_logical_pointer == false)))) {
              SVar10 = Instruction::GetOperandAs<spv::StorageClass>(this,1);
              if (StorageBuffer < SVar10) {
LAB_0028b680:
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"Invalid storage class for pointer operand ");
                ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
                std::operator<<((ostream *)&local_208,(string *)&local_268);
                goto LAB_0028b109;
              }
              if ((0x4d1U >> (SVar10 & 0x1f) & 1) == 0) {
                if (SVar10 != StorageBuffer) goto LAB_0028b680;
                if ((_->features_).variable_pointers == false) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&local_208,"StorageBuffer pointer operand ");
                  ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
                  std::operator<<((ostream *)&local_208,(string *)&local_268);
                  pcVar23 = " requires a variable pointers capability";
                  goto LAB_0028aeba;
                }
              }
              uVar1 = (pIVar14->inst_).opcode;
              if (((uVar1 != 0x37) && (uVar1 != 0x3b)) && (uVar1 != 0x1142)) {
                bVar5 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,VariablePointersStorageBuffer);
                bVar6 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,VariablePointers);
                if (((SVar10 != UniformConstant) && (SVar10 != StorageBuffer || !bVar5)) &&
                   (SVar10 != Workgroup || !bVar6)) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&local_208,"Pointer operand ");
                  ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
                  std::operator<<((ostream *)&local_208,(string *)&local_268);
                  pcVar23 = " must be a memory object declaration";
                  goto LAB_0028aeba;
                }
              }
            }
            uVar24 = uVar24 + 1;
            sVar26 = sVar26 + 1;
          } while( true );
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar23 = 
        "OpFunctionCall Function <id>\'s parameter count does not match the argument count.";
      }
      goto LAB_0028b214;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)&local_208,"OpFunctionCall Function <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
    std::operator<<((ostream *)&local_208,(string *)&local_268);
    pcVar23 = " is not a function.";
LAB_0028aeba:
    std::operator<<((ostream *)&local_208,pcVar23);
LAB_0028b109:
    std::__cxx11::string::_M_dispose();
    sVar21 = local_208.error_;
  }
  else {
    if (uVar1 != 0x37) {
      if (uVar1 != 0x36) {
        return SPV_SUCCESS;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x21)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"OpFunction Function Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar7);
        std::operator<<((ostream *)&local_208,(string *)&local_268);
        pcVar23 = " is not a function type.";
        goto LAB_0028aeba;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      if (uVar7 == (inst->inst_).type_id) {
        local_208._32_8_ = 0x12700000126;
        local_208._40_8_ = 0x14500000128;
        local_208._16_8_ = 0x14b00000010;
        local_208._24_8_ = 0x12500000039;
        local_208.stream_ = (ostringstream)0x4a;
        local_208._1_7_ = 0x47000000;
        local_208._8_8_ = 0xf00000124;
        local_208._48_8_ = 0x500000146;
        acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<spv::Op,std::allocator<spv::Op>>::_M_range_initialize<spv::Op_const*>
                  ((vector<spv::Op,std::allocator<spv::Op>> *)&acceptable,&local_208);
        ppVar2 = (inst->uses_).
                 super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar25 = (inst->uses_).
                       super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; uVar4 = local_208._0_8_,
            ppVar25 != ppVar2; ppVar25 = ppVar25 + 1) {
          pIVar11 = ppVar25->first;
          local_208._2_2_ = 0;
          local_208._0_2_ = (pIVar11->inst_).opcode;
          local_208._4_4_ = SUB84(uVar4,4);
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                             (acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&local_208);
          if (((_Var12._M_current ==
                acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
                super__Vector_impl_data._M_finish) &&
              (bVar5 = Instruction::IsNonSemantic(pIVar11), !bVar5)) &&
             (bVar5 = Instruction::IsDebugInfo(pIVar11), !bVar5)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
            std::operator<<((ostream *)&local_208,"Invalid use of function result id ");
            ValidationState_t::getIdName_abi_cxx11_(&local_268,_,(inst->inst_).result_id);
            std::operator<<((ostream *)&local_208,(string *)&local_268);
            std::operator<<((ostream *)&local_208,".");
            std::__cxx11::string::_M_dispose();
            DiagnosticStream::~DiagnosticStream(&local_208);
            sVar21 = local_208.error_;
            goto LAB_0028b192;
          }
        }
        sVar21 = SPV_SUCCESS;
LAB_0028b192:
        std::_Vector_base<spv::Op,_std::allocator<spv::Op>_>::~_Vector_base
                  (&acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>);
        goto LAB_0028b22b;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_208,"OpFunction Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_268,_,(inst->inst_).type_id);
      std::operator<<((ostream *)&local_208,(string *)&local_268);
      std::operator<<((ostream *)&local_208," does not match the Function Type\'s return type <id> "
                     );
      ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,uVar7);
      std::operator<<((ostream *)&local_208,(string *)&acceptable);
      pcVar23 = ".";
LAB_0028b0f2:
      std::operator<<((ostream *)&local_208,pcVar23);
      std::__cxx11::string::_M_dispose();
      goto LAB_0028b109;
    }
    sVar26 = inst->line_num_;
    if (sVar26 == 1) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar23 = "Function parameter cannot be the first instruction.";
LAB_0028b214:
      std::operator<<((ostream *)&local_208,pcVar23);
      sVar21 = local_208.error_;
    }
    else {
      pIVar3 = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = pIVar3 + (sVar26 - 2);
      lVar13 = sVar26 - 2;
      uVar24 = 0;
      while (bVar5 = lVar13 != 0, lVar13 = lVar13 + -1, bVar5) {
        uVar1 = (this_00->inst_).opcode;
        if (uVar1 == 0x36) goto LAB_0028af25;
        uVar24 = uVar24 + (uVar1 == 0x37);
        this_00 = this_00 + -1;
      }
      this_00 = pIVar3 + 1;
      if (pIVar3[1].inst_.opcode != 0x36) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar23 = "Function parameter must be preceded by a function.";
        goto LAB_0028b214;
      }
LAB_0028af25:
      uVar7 = Instruction::GetOperandAs<unsigned_int>(this_00,3);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,this_00);
        std::operator<<((ostream *)&local_208,"Missing function type definition.");
        sVar21 = local_208.error_;
      }
      else {
        if (uVar24 < ((long)(pIVar11->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pIVar11->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 3U) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,uVar24 + 2);
          pIVar11 = ValidationState_t::FindDef(_,uVar7);
          if ((pIVar11 == (Instruction *)0x0) ||
             (id_02 = (inst->inst_).type_id, id_02 != (pIVar11->inst_).result_id)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_208,"OpFunctionParameter Result Type <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_268,_,(inst->inst_).type_id);
            std::operator<<((ostream *)&local_208,(string *)&local_268);
            pcVar23 = " does not match the OpTypeFunction parameter type of the same index.";
            goto LAB_0028aeba;
          }
          while (OVar9 = ValidationState_t::GetIdOpcode(_,id_02), OVar9 == OpTypeArray) {
            pIVar11 = ValidationState_t::FindDef(_,id_02);
            id_02 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
          }
          OVar9 = ValidationState_t::GetIdOpcode(_,id_02);
          if ((OVar9 != OpTypePointer) &&
             (OVar9 = ValidationState_t::GetIdOpcode(_,id_02), OVar9 != OpTypeUntypedPointerKHR)) {
            return SPV_SUCCESS;
          }
          pIVar11 = ValidationState_t::FindDef(_,id_02);
          SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,1);
          if (SVar10 == PhysicalStorageBuffer) {
            psVar18 = ValidationState_t::id_decorations(_,(inst->inst_).result_id);
            p_Var22 = &(psVar18->_M_t)._M_impl.super__Rb_tree_header;
            p_Var20 = (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var19 = p_Var20;
                ((_Rb_tree_header *)p_Var19 != p_Var22 && (p_Var19[1]._M_color != 0x14));
                p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
            }
            for (; (_Rb_tree_header *)p_Var20 != p_Var22;
                p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
              if (p_Var20[1]._M_color == 0x13) {
                if ((_Rb_tree_header *)p_Var19 == p_Var22) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"OpFunctionParameter ");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar23 = 
                ": can\'t specify both Aliased and Restrict for PhysicalStorageBuffer pointer.";
                goto LAB_0028b214;
              }
            }
            if ((_Rb_tree_header *)p_Var19 != p_Var22) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_208,"OpFunctionParameter ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar23 = ": expected Aliased or Restrict for PhysicalStorageBuffer pointer.";
          }
          else {
            if ((pIVar11->inst_).opcode != 0x20) {
              return SPV_SUCCESS;
            }
            uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
            pIVar11 = ValidationState_t::FindDef(_,uVar7);
            if ((pIVar11->inst_).opcode != 0x20) {
              return SPV_SUCCESS;
            }
            SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,1);
            if (SVar10 != PhysicalStorageBuffer) {
              return SPV_SUCCESS;
            }
            psVar18 = ValidationState_t::id_decorations(_,(inst->inst_).result_id);
            p_Var22 = &(psVar18->_M_t)._M_impl.super__Rb_tree_header;
            p_Var20 = (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var19 = p_Var20;
                ((_Rb_tree_header *)p_Var19 != p_Var22 && (p_Var19[1]._M_color != 0x14ec));
                p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
            }
            for (; (_Rb_tree_header *)p_Var20 != p_Var22;
                p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
              if (p_Var20[1]._M_color == 0x14eb) {
                if ((_Rb_tree_header *)p_Var19 == p_Var22) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"OpFunctionParameter ");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar23 = 
                ": can\'t specify both AliasedPointer and RestrictPointer for PhysicalStorageBuffer pointer."
                ;
                goto LAB_0028b214;
              }
            }
            if ((_Rb_tree_header *)p_Var19 != p_Var22) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_208,"OpFunctionParameter ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar23 = 
            ": expected AliasedPointer or RestrictPointer for PhysicalStorageBuffer pointer.";
          }
          goto LAB_0028b214;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"Too many OpFunctionParameters for ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208,": expected ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208," based on the function\'s type");
        sVar21 = local_208.error_;
      }
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_0028b22b:
  if (sVar21 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar21;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}